

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void handle_C_option(char *z)

{
  size_t sVar1;
  char *__dest;
  long lVar2;
  
  sVar1 = strlen(z);
  lVar2 = sVar1 << 0x20;
  __dest = (char *)malloc(lVar2 + 0x200000000 >> 0x20);
  output_dir = __dest;
  if (__dest != (char *)0x0) {
    strcpy(__dest,z);
    if (__dest[lVar2 + -0x100000000 >> 0x20] != '/') {
      __dest[lVar2 >> 0x20] = '/';
      __dest[lVar2 + 0x100000000 >> 0x20] = '\0';
    }
    return;
  }
  memory_error();
}

Assistant:

static void handle_C_option(char *z){
  int len = lemonStrlen(z);
  output_dir = (char *) malloc( len+2 );
  if( output_dir==0 ){
    memory_error();
  }
  strcpy(output_dir, z);
  if( !is_seperator(output_dir[len-1]) ){
    output_dir[len] = '/';
    output_dir[len+1] = '\0';
  }
}